

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  if (str_end == (char *)0x0) {
    sVar4 = strlen(str);
    uVar7 = (uint)sVar4;
  }
  else {
    uVar7 = (int)str_end - (int)str;
  }
  iVar6 = (this->Buf).Size;
  iVar2 = (this->Buf).Capacity;
  iVar6 = iVar6 + (uint)(iVar6 == 0);
  iVar5 = uVar7 + iVar6;
  if (iVar5 < iVar2) {
LAB_001371af:
    if (iVar5 <= iVar2) goto LAB_00137251;
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar5) {
      iVar8 = iVar5;
    }
  }
  else {
    iVar8 = iVar2 * 2;
    if (iVar5 != iVar8 && SBORROW4(iVar5,iVar8) == iVar5 + iVar2 * -2 < 0) {
      iVar8 = iVar5;
    }
    if (iVar8 <= iVar2) goto LAB_001371af;
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar8,GImAllocatorUserData);
  pcVar3 = (this->Buf).Data;
  if (pcVar3 != (char *)0x0) {
    memcpy(__dest,pcVar3,(long)(this->Buf).Size);
    pcVar3 = (this->Buf).Data;
    if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
  }
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = iVar8;
LAB_00137251:
  (this->Buf).Size = iVar5;
  if (-1 < (int)uVar7) {
    memcpy((this->Buf).Data + (long)iVar6 + -1,str,(ulong)(uVar7 & 0x7fffffff));
    iVar6 = iVar6 + uVar7 + -1;
    if (iVar6 < (this->Buf).Size) {
      (this->Buf).Data[iVar6] = '\0';
      return;
    }
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4d8,"T &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}